

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

void __thiscall MeshLib::Solid::add(Solid *this,Solid *solid)

{
  Vertex *pVVar1;
  tVertex pVVar2;
  double dVar3;
  tFace pFVar4;
  int i;
  long lVar5;
  int v [3];
  TreeIterator<MeshLib::Vertex> viter;
  int local_14c [3];
  TreeIterator<MeshLib::Vertex> local_140;
  
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_140,&solid->m_verts);
  if (local_140.m_finished == false) {
    do {
      pVVar1 = (local_140.m_pointer)->data;
      pVVar2 = createVertex(this,pVVar1->m_id);
      dVar3 = (pVVar1->m_point).v[1];
      (pVVar2->m_point).v[0] = (pVVar1->m_point).v[0];
      (pVVar2->m_point).v[1] = dVar3;
      (pVVar2->m_point).v[2] = (pVVar1->m_point).v[2];
      std::__cxx11::string::_M_assign((string *)&pVVar2->m_string);
      pVVar2->m_boundary = pVVar1->m_boundary;
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_140);
    } while (local_140.m_finished == false);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator
            ((TreeIterator<MeshLib::Face> *)&local_140,&solid->m_faces);
  if (local_140.m_finished == false) {
    do {
      pVVar1 = (local_140.m_pointer)->data;
      dVar3 = (pVVar1->m_point).v[0];
      lVar5 = 0;
      do {
        local_14c[lVar5] = **(int **)((long)dVar3 + 0x10);
        dVar3 = *(double *)((long)dVar3 + 0x20);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pFVar4 = createFace(this,local_14c,pVVar1->m_id);
      std::__cxx11::string::_M_assign((string *)&pFVar4->m_string);
      AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&local_140);
    } while (local_140.m_finished == false);
  }
  labelBoundaryEdges(this);
  return;
}

Assistant:

void Solid::add( Solid & solid )
{	
	for(AVL::TreeIterator<Vertex> viter(solid.m_verts); !viter.end(); ++viter)
	{
		Vertex * v = *viter;
		Vertex * w = createVertex( v->id() );

		w->point() = v->point();
		w->string()= v->string();
		w->boundary() = v->boundary();
	}

	for(AVL::TreeIterator<Face> fiter(solid.m_faces); !fiter.end(); ++fiter)
	{
		Face * f = *fiter;

		HalfEdge * he = f->halfedge();
		int v[3];

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->vertex()->id();
			he = he->he_next();
		}

		Face * F = createFace(v, f->id() );
		F->string() = f->string();
	}

	labelBoundaryEdges();

}